

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall
CTcPrsOpSub::eval_constant(CTcPrsOpSub *this,CTcPrsNode *left,CTcPrsNode *right)

{
  CTPNListBase *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsNode *pCVar3;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  CTcConstVal *val;
  char *pcVar4;
  
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    return (CTcPrsNode *)0x0;
  }
  iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    return (CTcPrsNode *)0x0;
  }
  iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
  iVar1 = *(int *)CONCAT44(extraout_var_01,iVar1);
  iVar2 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
  iVar2 = *(int *)CONCAT44(extraout_var_02,iVar2);
  if (iVar1 < 7) {
    if (iVar1 == 3) goto LAB_0022c8b8;
  }
  else {
    if (iVar1 == 7) {
      return (CTcPrsNode *)0x0;
    }
    if (iVar1 != 0xd) goto LAB_0022c935;
LAB_0022c8b8:
    if ((iVar2 == 0xd) || (iVar2 == 3)) {
      pCVar3 = CTcPrsOpArith::eval_constant(&this->super_CTcPrsOpArith,left,right);
      return pCVar3;
    }
    if (iVar1 == 7) {
      return (CTcPrsNode *)0x0;
    }
  }
  if (iVar1 == 6) {
    iVar1 = (*(left->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(left);
    this_00 = *(CTPNListBase **)(CONCAT44(extraout_var_03,iVar1) + 8);
    iVar1 = (*(right->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(right);
    if (iVar2 == 6) {
      for (pcVar4 = (((((CTcConstVal *)CONCAT44(extraout_var_04,iVar1))->val_).funcptrval_)->
                    super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
                    super_CVmHashEntry.str_; pcVar4 != (char *)0x0;
          pcVar4 = *(char **)(pcVar4 + 0x10)) {
        val = (CTcConstVal *)(**(code **)(**(long **)(pcVar4 + 8) + 8))();
        CTPNListBase::remove_element(this_00,val);
      }
      return left;
    }
    CTPNListBase::remove_element(this_00,(CTcConstVal *)CONCAT44(extraout_var_04,iVar1));
    return left;
  }
LAB_0022c935:
  CTcTokenizer::log_error(0x2b1a);
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpSub::eval_constant(CTcPrsNode *left,
                                       CTcPrsNode *right) const
{
    if (left->is_const() && right->is_const())
    {
        tc_constval_type_t typ1, typ2;

        /* get the types */
        typ1 = left->get_const_val()->get_type();
        typ2 = right->get_const_val()->get_type();

        /* check our types */
        if ((typ1 == TC_CVT_INT || typ1 == TC_CVT_FLOAT)
            && (typ2 == TC_CVT_INT || typ2 == TC_CVT_FLOAT))
        {
            /* int/float minus int/float - use the inherited handling */
            return CTcPrsOpArith::eval_constant(left, right);
        }
        else if (typ1 == TC_CVT_LIST)
        {
            /* get the original list */
            CTPNList *lst = left->get_const_val()->get_val_list();

            /* 
             *   if the right side is a list, remove each element of that
             *   list from the list on the left; otherwise, remove the
             *   value on the right from the list on the left 
             */
            if (typ2 == TC_CVT_LIST)
            {
                /* remove each element of the rhs list from the lhs list */
                CTPNListEle *ele;

                /* scan the list, adding each element */
                for (ele = right->get_const_val()
                           ->get_val_list()->get_head() ;
                     ele != 0 ; ele = ele->get_next())
                {
                    /* add this element's underlying expression value */
                    lst->remove_element(ele->get_expr()->get_const_val());
                }
            }
            else
            {
                /* remove the rhs value from the lhs list */
                lst->remove_element(right->get_const_val());
            }
        }
        else if (typ1 == TC_CVT_OBJ)
        {
            /* 
             *   assume it's an overloaded operator, in which case constant
             *   evaluation isn't possible, but it could still be a legal
             *   expression 
             */
            return 0;
        }
        else
        {
            /* these types are incompatible - log an error */
            G_tok->log_error(TCERR_CONST_BINMINUS_INCOMPAT);
            return 0;
        }

        /* return the updated left side */
        return left;
    }
    else
    {
        /* they're not constant - we can't generate a constant result */
        return 0;
    }
}